

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O3

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::run(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
      *this)

{
  ulong uVar1;
  runtime_error *this_00;
  ulong uVar2;
  
  uVar1 = (long)(this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar2 = (long)(this->cols_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->cols_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar1 <= uVar2) {
    uVar2 = uVar1;
  }
  this->max_matches_ = uVar2;
  do {
    switch(this->step_) {
    case ONE:
      step_one(this);
      break;
    case TWO:
      step_two(this);
      break;
    case THREE:
      step_three(this);
      break;
    case FOUR:
      step_four(this);
      break;
    case FIVE:
      step_five(this);
      break;
    case SIX:
      step_six(this);
      break;
    case SEVEN:
      return;
    default:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Failed to handle step code!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  } while( true );
}

Assistant:

void
Matching<GRAPH, COST, MASK>::run()
{
    max_matches_ = std::min(rows_.size(), cols_.size());

    while (true) {
        switch (step_) {
            case Step::ONE:
                step_one();
                break;
            case Step::TWO:
                step_two();
                break;
            case Step::THREE:
                step_three();
                break;
            case Step::FOUR:
                step_four();
                break;
            case Step::FIVE:
                step_five();
                break;
            case Step::SIX:
                step_six();
                break;
            case Step::SEVEN:
                return;
            default:
                throw std::runtime_error("Failed to handle step code!");
        }
    }
}